

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rbuCheckpointFrame(sqlite3rbu *p,RbuFrame *pFrame)

{
  sqlite3_file *psVar1;
  sqlite3_file *psVar2;
  int iVar3;
  i64 iOff;
  sqlite3_file *pDb;
  sqlite3_file *pWal;
  RbuFrame *pFrame_local;
  sqlite3rbu *p_local;
  
  psVar1 = p->pTargetFd->pWalFd->pReal;
  psVar2 = p->pTargetFd->pReal;
  iVar3 = (*psVar1->pMethods->xRead)
                    (psVar1,p->aBuf,p->pgsz,
                     (ulong)(pFrame->iWalFrame - 1) * (long)(p->pgsz + 0x18) + 0x38);
  p->rc = iVar3;
  if (p->rc == 0) {
    iVar3 = (*psVar2->pMethods->xWrite)
                      (psVar2,p->aBuf,p->pgsz,(ulong)(pFrame->iDbPage - 1) * (long)p->pgsz);
    p->rc = iVar3;
  }
  return;
}

Assistant:

static void rbuCheckpointFrame(sqlite3rbu *p, RbuFrame *pFrame){
  sqlite3_file *pWal = p->pTargetFd->pWalFd->pReal;
  sqlite3_file *pDb = p->pTargetFd->pReal;
  i64 iOff;

  assert( p->rc==SQLITE_OK );
  iOff = (i64)(pFrame->iWalFrame-1) * (p->pgsz + 24) + 32 + 24;
  p->rc = pWal->pMethods->xRead(pWal, p->aBuf, p->pgsz, iOff);
  if( p->rc ) return;

  iOff = (i64)(pFrame->iDbPage-1) * p->pgsz;
  p->rc = pDb->pMethods->xWrite(pDb, p->aBuf, p->pgsz, iOff);
}